

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O1

Table<unsigned_int,_kj::InsertionOrderIndex> * __thiscall
kj::_::NullableValue<kj::Table<unsigned_int,kj::InsertionOrderIndex>>::
emplace<kj::Table<unsigned_int,kj::InsertionOrderIndex>>
          (NullableValue<kj::Table<unsigned_int,kj::InsertionOrderIndex>> *this,
          Table<unsigned_int,_kj::InsertionOrderIndex> *params)

{
  long lVar1;
  long lVar2;
  long lVar3;
  
  if (*this == (NullableValue<kj::Table<unsigned_int,kj::InsertionOrderIndex>>)0x1) {
    *this = (NullableValue<kj::Table<unsigned_int,kj::InsertionOrderIndex>>)0x0;
    InsertionOrderIndex::~InsertionOrderIndex((InsertionOrderIndex *)(this + 0x28));
    lVar1 = *(long *)(this + 8);
    if (lVar1 != 0) {
      lVar2 = *(long *)(this + 0x10);
      lVar3 = *(long *)(this + 0x18);
      *(long *)(this + 8) = 0;
      *(undefined8 *)(this + 0x10) = 0;
      *(undefined8 *)(this + 0x18) = 0;
      (**(code **)**(undefined8 **)(this + 0x20))
                (*(undefined8 **)(this + 0x20),lVar1,4,lVar2 - lVar1 >> 2,lVar3 - lVar1 >> 2,0);
    }
  }
  *(StringPtr **)(this + 8) = (params->rows).builder.ptr;
  *(RemoveConst<kj::StringPtr> **)(this + 0x10) = (params->rows).builder.pos;
  *(StringPtr **)(this + 0x18) = (params->rows).builder.endPtr;
  *(ArrayDisposer **)(this + 0x20) = (params->rows).builder.disposer;
  (params->rows).builder.ptr = (StringPtr *)0x0;
  (params->rows).builder.pos = (RemoveConst<kj::StringPtr> *)0x0;
  (params->rows).builder.endPtr = (StringPtr *)0x0;
  InsertionOrderIndex::InsertionOrderIndex((InsertionOrderIndex *)(this + 0x28),&params->indexes);
  *this = (NullableValue<kj::Table<unsigned_int,kj::InsertionOrderIndex>>)0x1;
  return (Table<unsigned_int,_kj::InsertionOrderIndex> *)(this + 8);
}

Assistant:

inline T& emplace(Params&&... params) {
    if (isSet) {
      isSet = false;
      dtor(value);
    }
    ctor(value, kj::fwd<Params>(params)...);
    isSet = true;
    return value;
  }